

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVLD2DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  byte bVar4;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t extraout_RDX_02;
  uint RegNo;
  
  RegNo = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  bVar4 = (byte)Insn >> 6;
  Decoder_00 = (void *)(ulong)CONCAT31((int3)(Insn >> 8),bVar4);
  uVar1 = MCInst_getOpcode(Inst);
  if (uVar1 - 0x39d < 0x12) {
    Decoder_00 = (void *)0x71c7;
    if ((0x71c7U >> (uVar1 - 0x39d & 0x1f) & 1) == 0) {
      DVar2 = DecodeDPairSpacedRegisterClass(Inst,RegNo,Address_00,(void *)0x71c7);
      Address_01 = extraout_RDX_00;
    }
    else {
      DVar2 = DecodeDPairRegisterClass(Inst,RegNo,Address_00,(void *)0x71c7);
      Address_01 = extraout_RDX;
    }
  }
  else {
    DVar2 = DecodeDPRRegisterClass(Inst,RegNo,Address_00,Decoder_00);
    Address_01 = extraout_RDX_02;
  }
  if ((DVar2 | 2) == MCDisassembler_Success) {
    uVar1 = Insn & 0xf;
    if (uVar1 != 0xf) {
      MCOperand_CreateImm0(Inst,0);
      Address_01 = extraout_RDX_01;
    }
    DVar3 = DecodeGPRRegisterClass(Inst,Insn >> 0x10 & 0xf,Address_01,Decoder_00);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar2 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)(uint)((int)(Insn << 0x1b) >> 0x1f & 2 << bVar4));
    if ((((uVar1 | 2) != 0xf) &&
        (DVar3 = DecodeGPRRegisterClass(Inst,uVar1,Address_02,Decoder_00),
        DVar3 != MCDisassembler_Success)) &&
       (DVar2 = MCDisassembler_Fail, DVar3 == MCDisassembler_SoftFail)) {
      DVar2 = MCDisassembler_SoftFail;
    }
  }
  else {
    DVar2 = MCDisassembler_Fail;
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeVLD2DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, align, size;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	align = fieldFromInstruction_4(Insn, 4, 1);
	size = 1 << fieldFromInstruction_4(Insn, 6, 2);
	align *= 2*size;

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD2DUPd16: case ARM_VLD2DUPd32: case ARM_VLD2DUPd8:
		case ARM_VLD2DUPd16wb_fixed: case ARM_VLD2DUPd16wb_register:
		case ARM_VLD2DUPd32wb_fixed: case ARM_VLD2DUPd32wb_register:
		case ARM_VLD2DUPd8wb_fixed: case ARM_VLD2DUPd8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD2DUPd16x2: case ARM_VLD2DUPd32x2: case ARM_VLD2DUPd8x2:
		case ARM_VLD2DUPd16x2wb_fixed: case ARM_VLD2DUPd16x2wb_register:
		case ARM_VLD2DUPd32x2wb_fixed: case ARM_VLD2DUPd32x2wb_register:
		case ARM_VLD2DUPd8x2wb_fixed: case ARM_VLD2DUPd8x2wb_register:
			if (!Check(&S, DecodeDPairSpacedRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
	}

	if (Rm != 0xF)
		MCOperand_CreateImm0(Inst, 0);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);

	if (Rm != 0xD && Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}